

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O0

mz_ulong mz_crc32(mz_ulong crc,mz_uint8 *ptr,size_t buf_len)

{
  uint uVar1;
  uint local_2c;
  mz_uint8 b;
  size_t sStack_28;
  mz_uint32 crcu32;
  size_t buf_len_local;
  mz_uint8 *ptr_local;
  mz_ulong crc_local;
  
  if (ptr == (mz_uint8 *)0x0) {
    crc_local = 0;
  }
  else {
    local_2c = (uint)crc ^ 0xffffffff;
    sStack_28 = buf_len;
    buf_len_local = (size_t)ptr;
    while (sStack_28 != 0) {
      uVar1 = local_2c >> 4 ^ mz_crc32::s_crc32[local_2c & 0xf ^ *(byte *)buf_len_local & 0xf];
      local_2c = uVar1 >> 4 ^
                 mz_crc32::s_crc32[uVar1 & 0xf ^ (int)(uint)*(byte *)buf_len_local >> 4];
      sStack_28 = sStack_28 - 1;
      buf_len_local = buf_len_local + 1;
    }
    crc_local = (mz_ulong)(local_2c ^ 0xffffffff);
  }
  return crc_local;
}

Assistant:

mz_ulong mz_crc32(mz_ulong crc, const mz_uint8 *ptr, size_t buf_len)
{
  static const mz_uint32 s_crc32[16] = { 0, 0x1db71064, 0x3b6e20c8, 0x26d930ac, 0x76dc4190, 0x6b6b51f4, 0x4db26158, 0x5005713c,
    0xedb88320, 0xf00f9344, 0xd6d6a3e8, 0xcb61b38c, 0x9b64c2b0, 0x86d3d2d4, 0xa00ae278, 0xbdbdf21c };
  mz_uint32 crcu32 = (mz_uint32)crc;
  if (!ptr) return MZ_CRC32_INIT;
  crcu32 = ~crcu32; while (buf_len--) { mz_uint8 b = *ptr++; crcu32 = (crcu32 >> 4) ^ s_crc32[(crcu32 & 0xF) ^ (b & 0xF)]; crcu32 = (crcu32 >> 4) ^ s_crc32[(crcu32 & 0xF) ^ (b >> 4)]; }
  return ~crcu32;
}